

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Index * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_3,bool *args_4,AST **args_5,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_6,AST **args_7,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_8,AST **args_9,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_10)

{
  Index *target;
  AST *in_RCX;
  Fodder *in_RDX;
  AST *in_RSI;
  Fodder *in_RDI;
  Fodder *in_R8;
  AST *in_R9;
  undefined8 *in_stack_00000018;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_stack_00000020;
  Index *r;
  value_type *__x;
  undefined1 in_stack_ffffffffffffff7f;
  Fodder *in_stack_ffffffffffffff90;
  LocationRange *in_stack_ffffffffffffff98;
  Index *in_stack_ffffffffffffffa0;
  Fodder *id_fodder;
  
  id_fodder = in_RDI;
  target = (Index *)operator_new(0x110);
  __x = (value_type *)*in_stack_00000018;
  Index::Index(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (AST *)target,in_RDI,(bool)in_stack_ffffffffffffff7f,in_R9,in_R8,in_RCX,in_RDX,in_RSI
               ,id_fodder);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (in_stack_00000020,__x);
  return target;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }